

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BBlockBase.h
# Opt level: O2

void __thiscall
dg::ElemWithEdges<dg::dda::RWBBlock>::addSuccessor
          (ElemWithEdges<dg::dda::RWBBlock> *this,RWBBlock *s)

{
  RWBBlock *pRVar1;
  pointer ppRVar2;
  EdgesT *__range2;
  RWBBlock *local_20;
  RWBBlock *local_18;
  
  ppRVar2 = (this->_successors).
            super__Vector_base<dg::dda::RWBBlock_*,_std::allocator<dg::dda::RWBBlock_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  do {
    if (ppRVar2 ==
        (this->_successors).
        super__Vector_base<dg::dda::RWBBlock_*,_std::allocator<dg::dda::RWBBlock_*>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      local_20 = s;
      std::vector<dg::dda::RWBBlock_*,_std::allocator<dg::dda::RWBBlock_*>_>::push_back
                (&this->_successors,&local_20);
      ppRVar2 = (local_20->super_BBlockBase<dg::dda::RWBBlock,_dg::dda::RWNode>).
                super_CFGElement<dg::dda::RWBBlock>.super_ElemWithEdges<dg::dda::RWBBlock>.
                _predecessors.
                super__Vector_base<dg::dda::RWBBlock_*,_std::allocator<dg::dda::RWBBlock_*>_>.
                _M_impl.super__Vector_impl_data._M_start;
      do {
        if (ppRVar2 ==
            *(pointer *)
             ((long)&(local_20->super_BBlockBase<dg::dda::RWBBlock,_dg::dda::RWNode>).
                     super_CFGElement<dg::dda::RWBBlock>.super_ElemWithEdges<dg::dda::RWBBlock>.
                     _predecessors.
                     super__Vector_base<dg::dda::RWBBlock_*,_std::allocator<dg::dda::RWBBlock_*>_>.
                     _M_impl.super__Vector_impl_data + 8)) {
          local_18 = (RWBBlock *)
                     &this[-1]._predecessors.
                      super__Vector_base<dg::dda::RWBBlock_*,_std::allocator<dg::dda::RWBBlock_*>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage;
          std::vector<dg::dda::RWBBlock*,std::allocator<dg::dda::RWBBlock*>>::
          emplace_back<dg::dda::RWBBlock*>
                    ((vector<dg::dda::RWBBlock*,std::allocator<dg::dda::RWBBlock*>> *)
                     &(local_20->super_BBlockBase<dg::dda::RWBBlock,_dg::dda::RWNode>).
                      super_CFGElement<dg::dda::RWBBlock>.super_ElemWithEdges<dg::dda::RWBBlock>.
                      _predecessors,&local_18);
          return;
        }
        pRVar1 = *ppRVar2;
        ppRVar2 = ppRVar2 + 1;
      } while (&(pRVar1->super_BBlockBase<dg::dda::RWBBlock,_dg::dda::RWNode>).
                super_CFGElement<dg::dda::RWBBlock>.super_ElemWithEdges<dg::dda::RWBBlock> != this
               || pRVar1 == (RWBBlock *)0x0);
      return;
    }
    pRVar1 = *ppRVar2;
    ppRVar2 = ppRVar2 + 1;
  } while (pRVar1 != s);
  return;
}

Assistant:

void addSuccessor(ElemT *s) {
        for (auto *succ : _successors) {
            if (succ == s)
                return;
        }

        _successors.push_back(s);

        for (auto *pred : s->_predecessors) {
            if (pred == this)
                return;
        }
        s->_predecessors.push_back(static_cast<ElemT *>(this));
    }